

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__decode_jpeg_image(stbi__jpeg *j)

{
  stbi_uc sVar1;
  byte bVar2;
  stbi__jpeg *in_RDI;
  stbi__uint32 NL;
  int Ld;
  int x;
  int m;
  int in_stack_00000064;
  stbi__jpeg *in_stack_00000068;
  stbi__jpeg *in_stack_00000178;
  stbi__jpeg *in_stack_ffffffffffffffd8;
  stbi__uint32 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  uint in_stack_ffffffffffffffe8;
  int iVar3;
  int local_4;
  
  for (iVar3 = 0; iVar3 < 4; iVar3 = iVar3 + 1) {
    in_RDI->img_comp[iVar3].raw_data = (void *)0x0;
    in_RDI->img_comp[iVar3].raw_coeff = (void *)0x0;
  }
  in_RDI->restart_interval = 0;
  iVar3 = stbi__decode_jpeg_header
                    ((stbi__jpeg *)CONCAT44(iVar3,in_stack_ffffffffffffffe8),
                     in_stack_ffffffffffffffe4);
  if (iVar3 == 0) {
    local_4 = 0;
  }
  else {
    sVar1 = stbi__get_marker(in_stack_ffffffffffffffd8);
    while (sVar1 != 0xd9) {
      if (sVar1 == 0xda) {
        iVar3 = stbi__process_scan_header
                          ((stbi__jpeg *)(ulong)CONCAT14(0xda,in_stack_ffffffffffffffe8));
        if (iVar3 == 0) {
          return 0;
        }
        iVar3 = stbi__parse_entropy_coded_data(in_stack_00000178);
        if (iVar3 == 0) {
          return 0;
        }
        if (in_RDI->marker == 0xff) {
          do {
            iVar3 = stbi__at_eof((stbi__context *)in_stack_ffffffffffffffd8);
            if (iVar3 != 0) goto LAB_00112d8b;
            bVar2 = stbi__get8((stbi__context *)in_stack_ffffffffffffffd8);
            in_stack_ffffffffffffffe8 = (uint)bVar2;
          } while (in_stack_ffffffffffffffe8 != 0xff);
          sVar1 = stbi__get8((stbi__context *)in_stack_ffffffffffffffd8);
          in_RDI->marker = sVar1;
        }
      }
      else if (sVar1 == 0xdc) {
        iVar3 = stbi__get16be((stbi__context *)
                              CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
        in_stack_ffffffffffffffe0 =
             stbi__get16be((stbi__context *)CONCAT44(iVar3,in_stack_ffffffffffffffe0));
        if (iVar3 != 4) {
          iVar3 = stbi__err("bad DNL len");
          return iVar3;
        }
        if (in_stack_ffffffffffffffe0 != in_RDI->s->img_y) {
          iVar3 = stbi__err("bad DNL height");
          return iVar3;
        }
        in_stack_ffffffffffffffe4 = 4;
      }
      else {
        iVar3 = stbi__process_marker(in_stack_00000068,in_stack_00000064);
        if (iVar3 == 0) {
          return 0;
        }
      }
LAB_00112d8b:
      sVar1 = stbi__get_marker(in_stack_ffffffffffffffd8);
    }
    if (in_RDI->progressive != 0) {
      stbi__jpeg_finish(in_RDI);
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int stbi__decode_jpeg_image(stbi__jpeg *j)
{
   int m;
   for (m = 0; m < 4; m++) {
      j->img_comp[m].raw_data = NULL;
      j->img_comp[m].raw_coeff = NULL;
   }
   j->restart_interval = 0;
   if (!stbi__decode_jpeg_header(j, STBI__SCAN_load)) return 0;
   m = stbi__get_marker(j);
   while (!stbi__EOI(m)) {
      if (stbi__SOS(m)) {
         if (!stbi__process_scan_header(j)) return 0;
         if (!stbi__parse_entropy_coded_data(j)) return 0;
         if (j->marker == STBI__MARKER_none ) {
            // handle 0s at the end of image data from IP Kamera 9060
            while (!stbi__at_eof(j->s)) {
               int x = stbi__get8(j->s);
               if (x == 255) {
                  j->marker = stbi__get8(j->s);
                  break;
               }
            }
            // if we reach eof without hitting a marker, stbi__get_marker() below will fail and we'll eventually return 0
         }
      } else if (stbi__DNL(m)) {
         int Ld = stbi__get16be(j->s);
         stbi__uint32 NL = stbi__get16be(j->s);
         if (Ld != 4) return stbi__err("bad DNL len", "Corrupt JPEG");
         if (NL != j->s->img_y) return stbi__err("bad DNL height", "Corrupt JPEG");
      } else {
         if (!stbi__process_marker(j, m)) return 0;
      }
      m = stbi__get_marker(j);
   }
   if (j->progressive)
      stbi__jpeg_finish(j);
   return 1;
}